

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

round_direction
fmt::v6::internal::get_round_direction(uint64_t divisor,uint64_t remainder,uint64_t error)

{
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int in_stack_ffffffffffffffdc;
  round_direction local_4;
  
  if (in_RDI <= in_RSI) {
    assert_fail(in_RDX,in_stack_ffffffffffffffdc,(char *)0x243489);
  }
  if (in_RDX < in_RDI) {
    if (in_RDX < in_RDI + -(long)in_RDX) {
      if ((in_RDI + -(long)in_RSI < in_RSI) ||
         (in_RDI + (long)in_RSI * -2 < (char *)((long)in_RDX * 2))) {
        if ((in_RSI < in_RDX) ||
           ((ulong)((long)in_RSI - (long)in_RDX) <
            (ulong)((long)in_RDI - ((long)in_RSI - (long)in_RDX)))) {
          local_4 = unknown;
        }
        else {
          local_4 = up;
        }
      }
      else {
        local_4 = down;
      }
      return local_4;
    }
    assert_fail(in_RDX,in_stack_ffffffffffffffdc,(char *)0x2434dd);
  }
  assert_fail(in_RDX,in_stack_ffffffffffffffdc,(char *)0x2434af);
}

Assistant:

inline round_direction get_round_direction(uint64_t divisor, uint64_t remainder,
                                           uint64_t error) {
  FMT_ASSERT(remainder < divisor, "");  // divisor - remainder won't overflow.
  FMT_ASSERT(error < divisor, "");      // divisor - error won't overflow.
  FMT_ASSERT(error < divisor - error, "");  // error * 2 won't overflow.
  // Round down if (remainder + error) * 2 <= divisor.
  if (remainder <= divisor - remainder && error * 2 <= divisor - remainder * 2)
    return round_direction::down;
  // Round up if (remainder - error) * 2 >= divisor.
  if (remainder >= error &&
      remainder - error >= divisor - (remainder - error)) {
    return round_direction::up;
  }
  return round_direction::unknown;
}